

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropymode.c
# Opt level: O0

void av1_init_mode_probs(FRAME_CONTEXT *fc)

{
  aom_cdf_prob *paVar1;
  undefined8 *puVar2;
  long lVar3;
  long in_RDI;
  int i;
  int local_c;
  
  memcpy((void *)(in_RDI + 0x25f8),default_palette_y_size_cdf,0x70);
  memcpy((void *)(in_RDI + 0x2668),default_palette_uv_size_cdf,0x70);
  memcpy((void *)(in_RDI + 0x26d8),default_palette_y_color_index_cdf,0x276);
  memcpy((void *)(in_RDI + 0x294e),default_palette_uv_color_index_cdf,0x276);
  memcpy((void *)(in_RDI + 0x376a),default_kf_y_mode_cdf,700);
  memcpy((void *)(in_RDI + 0x3a26),default_angle_delta_cdf,0x80);
  *(undefined8 *)(in_RDI + 0x2c4e) = 0x221d000000001734;
  *(undefined8 *)(in_RDI + 0x2c56) = 0x510100000000;
  *(undefined8 *)(in_RDI + 0x2c5e) = 0x56700000;
  *(undefined4 *)(in_RDI + 0x2c66) = 0x74ab;
  *(undefined2 *)(in_RDI + 0x2c6a) = 0;
  *(undefined8 *)(in_RDI + 0x2cd8) = 0x77ea000000007b52;
  *(undefined8 *)(in_RDI + 0x2ce0) = 0x5c3200000000;
  *(undefined8 *)(in_RDI + 0x2ce8) = 0x62b50000;
  *(undefined4 *)(in_RDI + 0x2cf0) = 0x2835;
  *(undefined2 *)(in_RDI + 0x2cf4) = 0;
  memcpy((void *)(in_RDI + 0x2cf6),default_uni_comp_ref_cdf,0x36);
  memcpy((void *)(in_RDI + 0x2bc4),default_palette_y_mode_cdf,0x7e);
  *(undefined8 *)(in_RDI + 0x2c42) = 0x2c10000000000133;
  *(undefined4 *)(in_RDI + 0x2c4a) = 0;
  memcpy((void *)(in_RDI + 0x2d2c),default_comp_ref_cdf,0x36);
  memcpy((void *)(in_RDI + 0x2d62),default_comp_bwdref_cdf,0x24);
  memcpy((void *)(in_RDI + 0x2c6c),default_single_ref_cdf,0x6c);
  memcpy((void *)(in_RDI + 0x2d86),default_txfm_partition_cdf,0x7e);
  memcpy((void *)(in_RDI + 0x2e04),default_compound_idx_cdfs,0x24);
  memcpy((void *)(in_RDI + 0x2e28),default_comp_group_idx_cdfs,0x24);
  memcpy((void *)(in_RDI + 0x1f9a),default_newmv_cdf,0x24);
  *(undefined8 *)(in_RDI + 0x1fbe) = 0x7be2000000007781;
  *(undefined4 *)(in_RDI + 0x1fc6) = 0;
  memcpy((void *)(in_RDI + 0x1fca),default_refmv_cdf,0x24);
  *(undefined8 *)(in_RDI + 0x1fee) = 0x2010000000004cd0;
  *(undefined8 *)(in_RDI + 0x1ff6) = 0x35ff00000000;
  *(undefined2 *)(in_RDI + 0x1ffe) = 0;
  memcpy((void *)(in_RDI + 0x24c4),default_motion_mode_cdf,0xb0);
  memcpy((void *)(in_RDI + 0x2574),default_obmc_cdf,0x84);
  memcpy((void *)(in_RDI + 0x2000),default_inter_compound_mode_cdf,0x90);
  memcpy((void *)(in_RDI + 0x2090),default_compound_type_cdf,0x84);
  memcpy((void *)(in_RDI + 0x2114),default_wedge_idx_cdf,0x2ec);
  *(undefined8 *)(in_RDI + 0x2400) = 0x16f9000000004000;
  *(undefined8 *)(in_RDI + 0x2408) = 0x143300000000;
  *(undefined8 *)(in_RDI + 0x2410) = 0x9e30000;
  memcpy((void *)(in_RDI + 0x2418),default_wedge_interintra_cdf,0x84);
  memcpy((void *)(in_RDI + 0x249c),default_interintra_mode_cdf,0x28);
  *(undefined8 *)(in_RDI + 0x30ca) = 0x4000000000004000;
  *(undefined8 *)(in_RDI + 0x30d2) = 0x400000000000;
  *(undefined2 *)(in_RDI + 0x30da) = 0;
  memcpy((void *)(in_RDI + 0x3112),default_filter_intra_cdfs,0x84);
  paVar1 = (aom_cdf_prob *)(in_RDI + 0x3196);
  paVar1[0] = 0x5d0b;
  paVar1[1] = 0x4e18;
  paVar1[2] = 0x3cc5;
  paVar1[3] = 0xc8a;
  *(undefined4 *)(in_RDI + 0x319e) = 0;
  *(aom_cdf_prob (*) [4])(in_RDI + 0x31a2) = (aom_cdf_prob  [4])0x27cb5b3b;
  *(undefined4 *)(in_RDI + 0x31aa) = 0x52ce;
  *(undefined2 *)(in_RDI + 0x31ae) = 0;
  *(undefined4 *)(in_RDI + 0x31b0) = 0x3e29;
  *(undefined2 *)(in_RDI + 0x31b4) = 0;
  memcpy((void *)(in_RDI + 0x31b6),default_if_y_mode_cdf,0x70);
  memcpy((void *)(in_RDI + 0x3226),default_uv_mode_cdf,0x30c);
  memcpy((void *)(in_RDI + 0x36ea),default_switchable_interp_cdf,0x80);
  memcpy((void *)(in_RDI + 0x3532),default_partition_cdf,0x1b8);
  memcpy((void *)(in_RDI + 0x3b42),default_intra_ext_tx_cdf,0x14b8);
  memcpy((void *)(in_RDI + 0x4ffa),default_inter_ext_tx_cdf,0x220);
  *(undefined8 *)(in_RDI + 0x2e4c) = 0x2f1c000000000093;
  *(undefined8 *)(in_RDI + 0x2e54) = 0x604100000000;
  *(undefined2 *)(in_RDI + 0x2e5c) = 0;
  *(undefined8 *)(in_RDI + 0x2e5e) = 0x3f7d000000000449;
  *(undefined8 *)(in_RDI + 0x2e66) = 0x6e2000000000;
  *(undefined2 *)(in_RDI + 0x2e6e) = 0;
  *(undefined8 *)(in_RDI + 0x2e70) = 0x3eea000000007cda;
  *(undefined8 *)(in_RDI + 0x2e78) = 0x312600000000;
  *(undefined8 *)(in_RDI + 0x2e80) = 0x18560000;
  for (local_c = 0; local_c < 3; local_c = local_c + 1) {
    puVar2 = (undefined8 *)(in_RDI + 0x30dc + (long)local_c * 0x12);
    lVar3 = (long)local_c;
    *puVar2 = *(undefined8 *)default_spatial_pred_seg_tree_cdf[lVar3];
    puVar2[1] = *(undefined8 *)(default_spatial_pred_seg_tree_cdf[lVar3] + 4);
    *(aom_cdf_prob *)(puVar2 + 2) = default_spatial_pred_seg_tree_cdf[lVar3][8];
  }
  memcpy((void *)(in_RDI + 0x3aa6),default_tx_size_cdf,0x60);
  paVar1 = (aom_cdf_prob *)(in_RDI + 0x3b06);
  paVar1[0] = 0x1200;
  paVar1[1] = 0x288;
  paVar1[2] = 0x5b;
  paVar1[3] = 0;
  *(undefined2 *)(in_RDI + 0x3b0e) = 0;
  paVar1 = (aom_cdf_prob *)(in_RDI + 0x3b38);
  paVar1[0] = 0x1200;
  paVar1[1] = 0x288;
  paVar1[2] = 0x5b;
  paVar1[3] = 0;
  *(undefined2 *)(in_RDI + 0x3b40) = 0;
  memcpy((void *)(in_RDI + 0x3b10),default_delta_lf_multi_cdf,0x28);
  paVar1 = (aom_cdf_prob *)(in_RDI + 0x521a);
  paVar1[0] = 0x7a76;
  paVar1[1] = 0x77b5;
  paVar1[2] = 0x4be4;
  paVar1[3] = 0x381b;
  paVar1 = (aom_cdf_prob *)(in_RDI + 0x5222);
  paVar1[0] = 0x16a4;
  paVar1[1] = 0x1149;
  paVar1[2] = 0x1da;
  paVar1[3] = 0;
  *(undefined2 *)(in_RDI + 0x522a) = 0;
  memcpy((void *)(in_RDI + 0x522c),default_cfl_alpha_cdf,0xcc);
  *(undefined4 *)(in_RDI + 0x30c4) = 0x8bd;
  *(undefined2 *)(in_RDI + 0x30c8) = 0;
  return;
}

Assistant:

void av1_init_mode_probs(FRAME_CONTEXT *fc) {
  av1_copy(fc->palette_y_size_cdf, default_palette_y_size_cdf);
  av1_copy(fc->palette_uv_size_cdf, default_palette_uv_size_cdf);
  av1_copy(fc->palette_y_color_index_cdf, default_palette_y_color_index_cdf);
  av1_copy(fc->palette_uv_color_index_cdf, default_palette_uv_color_index_cdf);
  av1_copy(fc->kf_y_cdf, default_kf_y_mode_cdf);
  av1_copy(fc->angle_delta_cdf, default_angle_delta_cdf);
  av1_copy(fc->comp_inter_cdf, default_comp_inter_cdf);
  av1_copy(fc->comp_ref_type_cdf, default_comp_ref_type_cdf);
  av1_copy(fc->uni_comp_ref_cdf, default_uni_comp_ref_cdf);
  av1_copy(fc->palette_y_mode_cdf, default_palette_y_mode_cdf);
  av1_copy(fc->palette_uv_mode_cdf, default_palette_uv_mode_cdf);
  av1_copy(fc->comp_ref_cdf, default_comp_ref_cdf);
  av1_copy(fc->comp_bwdref_cdf, default_comp_bwdref_cdf);
  av1_copy(fc->single_ref_cdf, default_single_ref_cdf);
  av1_copy(fc->txfm_partition_cdf, default_txfm_partition_cdf);
  av1_copy(fc->compound_index_cdf, default_compound_idx_cdfs);
  av1_copy(fc->comp_group_idx_cdf, default_comp_group_idx_cdfs);
  av1_copy(fc->newmv_cdf, default_newmv_cdf);
  av1_copy(fc->zeromv_cdf, default_zeromv_cdf);
  av1_copy(fc->refmv_cdf, default_refmv_cdf);
  av1_copy(fc->drl_cdf, default_drl_cdf);
  av1_copy(fc->motion_mode_cdf, default_motion_mode_cdf);
  av1_copy(fc->obmc_cdf, default_obmc_cdf);
  av1_copy(fc->inter_compound_mode_cdf, default_inter_compound_mode_cdf);
  av1_copy(fc->compound_type_cdf, default_compound_type_cdf);
  av1_copy(fc->wedge_idx_cdf, default_wedge_idx_cdf);
  av1_copy(fc->interintra_cdf, default_interintra_cdf);
  av1_copy(fc->wedge_interintra_cdf, default_wedge_interintra_cdf);
  av1_copy(fc->interintra_mode_cdf, default_interintra_mode_cdf);
  av1_copy(fc->seg.pred_cdf, default_segment_pred_cdf);
  av1_copy(fc->filter_intra_cdfs, default_filter_intra_cdfs);
  av1_copy(fc->filter_intra_mode_cdf, default_filter_intra_mode_cdf);
  av1_copy(fc->switchable_restore_cdf, default_switchable_restore_cdf);
  av1_copy(fc->wiener_restore_cdf, default_wiener_restore_cdf);
  av1_copy(fc->sgrproj_restore_cdf, default_sgrproj_restore_cdf);
  av1_copy(fc->y_mode_cdf, default_if_y_mode_cdf);
  av1_copy(fc->uv_mode_cdf, default_uv_mode_cdf);
  av1_copy(fc->switchable_interp_cdf, default_switchable_interp_cdf);
  av1_copy(fc->partition_cdf, default_partition_cdf);
  av1_copy(fc->intra_ext_tx_cdf, default_intra_ext_tx_cdf);
  av1_copy(fc->inter_ext_tx_cdf, default_inter_ext_tx_cdf);
  av1_copy(fc->skip_mode_cdfs, default_skip_mode_cdfs);
  av1_copy(fc->skip_txfm_cdfs, default_skip_txfm_cdfs);
  av1_copy(fc->intra_inter_cdf, default_intra_inter_cdf);
  for (int i = 0; i < SPATIAL_PREDICTION_PROBS; i++)
    av1_copy(fc->seg.spatial_pred_seg_cdf[i],
             default_spatial_pred_seg_tree_cdf[i]);
  av1_copy(fc->tx_size_cdf, default_tx_size_cdf);
  av1_copy(fc->delta_q_cdf, default_delta_q_cdf);
  av1_copy(fc->delta_lf_cdf, default_delta_lf_cdf);
  av1_copy(fc->delta_lf_multi_cdf, default_delta_lf_multi_cdf);
  av1_copy(fc->cfl_sign_cdf, default_cfl_sign_cdf);
  av1_copy(fc->cfl_alpha_cdf, default_cfl_alpha_cdf);
  av1_copy(fc->intrabc_cdf, default_intrabc_cdf);
}